

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTOpenGlider.cpp
# Opt level: O0

string * OGNGetIcaoAcType_abi_cxx11_(FlarmAircraftTy _acTy)

{
  bool bVar1;
  reference this;
  size_type sVar2;
  size_t i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *icaoTypes;
  size_type in_stack_ffffffffffffffa8;
  array<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_14UL>
  *in_stack_ffffffffffffffb0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffc0;
  string *local_8;
  
  this = std::
         array<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_14UL>
         ::at(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(in_stack_ffffffffffffffc0);
  if (bVar1) {
    local_8 = DataRefs::GetDefaultAcIcaoType_abi_cxx11_(&dataRefs);
  }
  else {
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(this);
    if (sVar2 == 1) {
      local_8 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::front(in_stack_ffffffffffffffb0->_M_elems);
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::size(this);
      sVar2 = randoml((long)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      local_8 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](this,sVar2);
    }
  }
  return local_8;
}

Assistant:

const std::string& OGNGetIcaoAcType (FlarmAircraftTy _acTy)
{
    try {
        const std::vector<std::string>& icaoTypes = dataRefs.aFlarmToIcaoAcTy.at(_acTy);
        if (icaoTypes.empty()) return dataRefs.GetDefaultAcIcaoType();
        if (icaoTypes.size() == 1) return icaoTypes.front();
        // more than one type defined, take a random pick
        const size_t i = (size_t)randoml(0, long(icaoTypes.size()) - 1);
        assert(0 <= i && i < icaoTypes.size());
        return icaoTypes[i];
    }
    catch (...) {
        return dataRefs.GetDefaultAcIcaoType();
    }
}